

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O3

bool __thiscall amrex::DeriveList::canDerive(DeriveList *this,string *name)

{
  pointer __s2;
  _List_node_base *__n;
  int iVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->lst).super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)this) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = (_List_node_base *)name->_M_string_length;
    do {
      if (*(_List_node_base **)((long)(p_Var2 + 1) + 8) == __n) {
        if (__n == (_List_node_base *)0x0) {
          return true;
        }
        iVar1 = bcmp(*(void **)&((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                                (p_Var2 + 1))->
                                super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>
                     ,__s2,(size_t)__n);
        if (iVar1 == 0) {
          return true;
        }
      }
      p_Var2 = (((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)&p_Var2->_M_next)->
               super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)this);
  }
  return false;
}

Assistant:

bool
DeriveList::canDerive (const std::string& name) const
{
    for (std::list<DeriveRec>::const_iterator li = lst.begin(), End = lst.end();
         li != End;
         ++li)
    {
        if (li->derive_name == name)
            return true;
    }
    return false;
}